

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  undefined4 uVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int iVar26;
  int iVar27;
  undefined8 *puVar28;
  const_reference ppLVar29;
  undefined8 *in_RCX;
  void **in_RDX;
  long in_RSI;
  long *in_RDI;
  bool bVar30;
  float fVar31;
  float fVar32;
  float fVar37;
  float fVar38;
  ulong uVar33;
  ulong uVar34;
  float fVar39;
  undefined1 auVar35 [16];
  float fVar40;
  float fVar43;
  float fVar44;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar36 [16];
  undefined1 auVar45 [16];
  Option opt_g;
  Layer *op;
  Mat top_blob_g;
  Mat bottom_blob_bordered_g;
  int g_1;
  Mat top_blob_unpacked;
  Option opt_p;
  Mat bottom_blob_bordered_unpacked;
  int out_g_elempack;
  int g_elempack;
  int num_output_g;
  int channels_g;
  __m128 _w;
  __m128 _val;
  int k;
  float *sptr;
  __m128 _sum;
  int j_1;
  int i_1;
  Mat m;
  float *kptr;
  float *outptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  size_t out_elemsize;
  int out_elempack;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_2;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  Mat *m_4;
  Mat *m_3;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  Option *in_stack_ffffffffffffd448;
  Mat *in_stack_ffffffffffffd450;
  Mat *in_stack_ffffffffffffd458;
  void **ppvVar46;
  undefined4 in_stack_ffffffffffffd460;
  int in_stack_ffffffffffffd464;
  size_t in_stack_ffffffffffffd468;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd470;
  Option *in_stack_ffffffffffffd478;
  Mat *in_stack_ffffffffffffd480;
  Mat *in_stack_ffffffffffffd488;
  Mat *in_stack_ffffffffffffd490;
  undefined7 in_stack_ffffffffffffd4e0;
  undefined1 in_stack_ffffffffffffd4e7;
  Option *in_stack_ffffffffffffd5d0;
  undefined4 in_stack_ffffffffffffd5d8;
  undefined4 in_stack_ffffffffffffd5dc;
  undefined4 in_stack_ffffffffffffd5e0;
  undefined4 in_stack_ffffffffffffd5e4;
  Mat *in_stack_ffffffffffffd5e8;
  Mat *in_stack_ffffffffffffd5f0;
  Mat *in_stack_ffffffffffffd5f8;
  Mat *in_stack_ffffffffffffd600;
  bool local_28b9;
  undefined8 local_28a8;
  long *plStack_28a0;
  undefined8 local_2898;
  undefined8 uStack_2890;
  undefined4 local_2888;
  undefined4 uStack_2884;
  undefined4 uStack_2880;
  undefined4 uStack_287c;
  undefined8 local_2878;
  undefined8 uStack_2870;
  value_type local_2860;
  void *local_2858;
  int *local_2850;
  void *local_2848;
  undefined4 local_2840;
  long *local_2838;
  undefined4 local_2830;
  int local_282c;
  int local_2828;
  int local_2824;
  int local_2820;
  ulong local_2818;
  void *local_2810;
  int *local_2808;
  ulong local_2800;
  undefined4 local_27f8;
  long *local_27f0;
  undefined4 local_27e8;
  int local_27e4;
  int local_27e0;
  int local_27dc;
  int local_27d8;
  ulong local_27d0;
  int local_27c4;
  void *local_27c0;
  int *local_27b8;
  void *local_27b0;
  undefined4 local_27a8;
  long *local_27a0;
  undefined4 local_2798;
  int local_2794;
  int local_2790;
  int local_278c;
  int local_2788;
  void *local_2780;
  undefined8 local_2778;
  undefined8 uStack_2770;
  undefined8 local_2768;
  undefined8 uStack_2760;
  undefined8 local_2758;
  undefined8 uStack_2750;
  undefined8 local_2748;
  undefined8 uStack_2740;
  void *local_2730;
  int *local_2728;
  ulong local_2720;
  undefined4 local_2718;
  long *local_2710;
  undefined4 local_2708;
  int local_2704;
  int local_2700;
  int local_26fc;
  int local_26f8;
  long local_26f0;
  int local_26e8;
  int local_26e4;
  int local_26e0;
  int local_26dc;
  undefined8 local_26d8;
  undefined8 uStack_26d0;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  int local_26b4;
  long local_26b0;
  undefined8 local_26a8;
  undefined8 uStack_26a0;
  int local_2690;
  int local_268c;
  undefined8 local_2688;
  undefined8 local_2680;
  undefined8 local_2678;
  undefined4 local_2670;
  long *local_2668;
  undefined4 local_2660;
  undefined4 local_265c;
  undefined4 local_2658;
  undefined4 local_2654;
  undefined4 local_2650;
  undefined8 local_2648;
  long local_2640;
  undefined8 local_2638;
  undefined8 local_2630;
  undefined8 local_2628;
  undefined4 local_2620;
  void *local_2618;
  undefined4 local_2610;
  undefined4 local_260c;
  undefined4 local_2608;
  undefined4 local_2604;
  undefined4 local_2600;
  undefined8 local_25f8;
  void *local_25f0;
  int local_25e8;
  int local_25e4;
  int local_25e0;
  int local_25dc;
  int local_25d8;
  int local_25d4;
  reference local_25d0;
  vector<int,_std::allocator<int>_> local_25c0;
  int local_25a4;
  long local_25a0;
  int local_2594;
  int local_2590;
  int local_258c;
  undefined4 local_2588;
  void *local_2578;
  int *local_2570;
  ulong local_2568;
  undefined4 local_2560;
  long *local_2558;
  undefined4 local_2550;
  int local_254c;
  int local_2548;
  int local_2544;
  int local_2540;
  long local_2538;
  undefined4 in_stack_ffffffffffffdad0;
  int iVar47;
  Mat *kernel;
  undefined4 in_stack_ffffffffffffdae8;
  int iVar48;
  int iVar49;
  int local_24e4;
  float local_2288;
  float fStack_2284;
  float fStack_2280;
  float fStack_227c;
  float local_2268;
  float fStack_2264;
  float fStack_2260;
  float fStack_225c;
  float local_2258;
  float fStack_2254;
  float fStack_2250;
  float fStack_224c;
  Option *in_stack_ffffffffffffde10;
  undefined1 in_stack_ffffffffffffde18 [16];
  undefined4 in_stack_ffffffffffffde28;
  undefined4 in_stack_ffffffffffffde2c;
  undefined4 in_stack_ffffffffffffde30;
  undefined4 in_stack_ffffffffffffde34;
  undefined4 in_stack_ffffffffffffe198;
  undefined4 in_stack_ffffffffffffe19c;
  undefined4 in_stack_ffffffffffffe1a0;
  undefined4 in_stack_ffffffffffffe1a4;
  undefined1 in_stack_ffffffffffffe1a8 [16];
  Mat *in_stack_ffffffffffffe1b8;
  float fStack_1e40;
  float fStack_1e3c;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  float local_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  float local_1a88;
  float fStack_1a84;
  float fStack_1a80;
  float fStack_1a7c;
  Option *in_stack_ffffffffffffe6b8;
  Mat *in_stack_ffffffffffffe6c0;
  Mat *in_stack_ffffffffffffe6c8;
  ConvolutionDepthWise_x86 *in_stack_ffffffffffffe6d0;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined4 in_stack_ffffffffffffe910;
  undefined4 in_stack_ffffffffffffe914;
  undefined4 in_stack_ffffffffffffe918;
  undefined4 in_stack_ffffffffffffe91c;
  undefined4 in_stack_ffffffffffffe920;
  undefined4 in_stack_ffffffffffffe924;
  Mat *in_stack_ffffffffffffe928;
  Mat *in_stack_ffffffffffffe930;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  float local_1628;
  float fStack_1624;
  float fStack_1620;
  float fStack_161c;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float local_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e28;
  undefined8 uStack_e20;
  float local_d88;
  float fStack_d84;
  float fStack_d80;
  float fStack_d7c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  undefined8 local_808;
  undefined8 uStack_800;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  
  if (((*(byte *)((long)in_RCX + 0x1e) & 1) != 0) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0)) {
    iVar25 = forward_int8_x86(in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8,
                              in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
    return iVar25;
  }
  iVar25 = *(int *)(in_RSI + 0x38);
  kernel = *(Mat **)(in_RSI + 0x10);
  iVar47 = *(int *)(in_RSI + 0x18);
  iVar26 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
           (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) + -1) + 1;
  iVar27 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) *
           (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) + -1) + 1;
  local_2578 = (void *)0x0;
  local_2570 = (int *)0x0;
  local_2568 = 0;
  local_2560 = 0;
  local_2558 = (long *)0x0;
  local_2550 = 0;
  local_254c = 0;
  local_2548 = 0;
  local_2544 = 0;
  local_2540 = 0;
  local_2538 = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
             in_stack_ffffffffffffd458,in_stack_ffffffffffffd450,in_stack_ffffffffffffd448);
  local_28b9 = local_2578 == (void *)0x0 || local_2538 * local_2540 == 0;
  if (local_28b9) {
    local_24e4 = -100;
    local_2588 = 1;
  }
  else {
    local_258c = (local_254c - iVar26) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4)
                 + 1;
    local_2590 = (local_2548 - iVar27) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)
                 + 1;
    local_2594 = 1;
    if (((*(byte *)((long)in_RCX + 0x27) & 1) != 0) &&
       (local_2594 = 1, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0)) {
      local_2594 = 4;
    }
    local_25a0 = ((ulong)kernel / (ulong)(long)iVar47) * (long)local_2594;
    iVar48 = local_2548;
    iVar49 = local_254c;
    Mat::create(in_stack_ffffffffffffd480,(int)((ulong)in_stack_ffffffffffffd478 >> 0x20),
                (int)in_stack_ffffffffffffd478,(int)((ulong)in_stack_ffffffffffffd470 >> 0x20),
                in_stack_ffffffffffffd468,in_stack_ffffffffffffd464,
                (Allocator *)CONCAT17(in_stack_ffffffffffffd4e7,in_stack_ffffffffffffd4e0));
    bVar30 = true;
    if (*in_RDX != (void *)0x0) {
      bVar30 = (long)in_RDX[8] * (long)*(int *)(in_RDX + 7) == 0;
    }
    if (bVar30) {
      local_24e4 = -100;
      local_2588 = 1;
    }
    else {
      if ((iVar25 * iVar47 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108)) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) ==
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
        if (iVar47 == 4) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            convdw3x3s1_pack4_sse
                      (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,
                       (Mat *)CONCAT44(in_stack_ffffffffffffe924,in_stack_ffffffffffffe920),
                       (Mat *)CONCAT44(in_stack_ffffffffffffe91c,in_stack_ffffffffffffe918),
                       (Option *)CONCAT44(in_stack_ffffffffffffe914,in_stack_ffffffffffffe910));
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_24e4 = 0;
            local_2588 = 1;
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convdw3x3s2_pack4_sse
                      ((Mat *)CONCAT44(in_stack_ffffffffffffde34,in_stack_ffffffffffffde30),
                       (Mat *)CONCAT44(in_stack_ffffffffffffde2c,in_stack_ffffffffffffde28),
                       in_stack_ffffffffffffde18._8_8_,in_stack_ffffffffffffde18._0_8_,
                       in_stack_ffffffffffffde10);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_24e4 = 0;
            local_2588 = 1;
          }
          else if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 5) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 5)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)))) &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)) {
            convdw5x5s1_pack4_sse
                      (in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1a8._8_8_,
                       in_stack_ffffffffffffe1a8._0_8_,
                       (Mat *)CONCAT44(in_stack_ffffffffffffe1a4,in_stack_ffffffffffffe1a0),
                       (Option *)CONCAT44(in_stack_ffffffffffffe19c,in_stack_ffffffffffffe198));
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_24e4 = 0;
            local_2588 = 1;
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 5) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 5)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convdw5x5s2_pack4_sse
                      ((Mat *)CONCAT44(iVar49,iVar48),
                       (Mat *)CONCAT44(iVar25,in_stack_ffffffffffffdae8),kernel,
                       (Mat *)CONCAT44(4,iVar26),
                       (Option *)CONCAT44(iVar27,in_stack_ffffffffffffdad0));
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_24e4 = 0;
            local_2588 = 1;
          }
          else {
            local_25a4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
            std::allocator<int>::allocator((allocator<int> *)0x17880be);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffd470,in_stack_ffffffffffffd468,
                       (allocator_type *)
                       CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460));
            std::allocator<int>::~allocator((allocator<int> *)0x17880ea);
            local_25d0 = std::vector<int,_std::allocator<int>_>::operator[](&local_25c0,0);
            local_25d4 = 0;
            local_25d8 = 0;
            local_25dc = iVar49 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) -
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
            for (local_25e0 = 0;
                local_25e0 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                local_25e0 = local_25e0 + 1) {
              for (local_25e4 = 0;
                  local_25e4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                  local_25e4 = local_25e4 + 1) {
                local_25d0[local_25d4] = local_25d8;
                local_25d4 = local_25d4 + 1;
                local_25d8 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_25d8
                ;
              }
              local_25d8 = local_25dc + local_25d8;
            }
            for (local_25e8 = 0; local_25e8 < iVar25; local_25e8 = local_25e8 + 1) {
              local_25f0 = (void *)((long)*in_RDX +
                                   (long)in_RDX[8] * (long)local_25e8 * (long)in_RDX[2]);
              local_2618 = in_RDX[4];
              local_2638 = 0;
              local_2628 = 0;
              local_2620 = 0;
              local_260c = 0;
              local_2608 = 0;
              local_2604 = 0;
              local_2600 = 0;
              local_2630 = 0;
              local_2640 = in_RDI[5] + (long)(local_25a4 * local_25e8 * 4) * 4;
              local_2668 = local_2558;
              local_25f8 = 0;
              local_2610 = 0;
              for (local_268c = 0; local_268c < local_2590; local_268c = local_268c + 1) {
                for (local_2690 = 0; local_2690 < local_258c; local_2690 = local_2690 + 1) {
                  local_26a8 = 0;
                  uStack_26a0 = 0;
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) != 0) {
                    puVar28 = (undefined8 *)
                              (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b0) +
                              (long)(local_25e8 << 2) * 4);
                    local_26a8 = *puVar28;
                    uStack_26a0 = puVar28[1];
                  }
                  local_26b0 = (long)local_2578 +
                               (long)(local_2690 *
                                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) * 4
                                     ) * 4 +
                               (long)local_254c *
                               (long)(local_268c *
                                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)) *
                               local_2568 + local_2538 * local_25e8 * local_2568;
                  local_26b4 = 0;
                  while( true ) {
                    local_2288 = (float)local_26a8;
                    fStack_2284 = (float)((ulong)local_26a8 >> 0x20);
                    fStack_2280 = (float)uStack_26a0;
                    fStack_227c = (float)((ulong)uStack_26a0 >> 0x20);
                    if (local_25a4 <= local_26b4) break;
                    puVar28 = (undefined8 *)(local_26b0 + (long)(local_25d0[local_26b4] << 2) * 4);
                    local_26c8 = *puVar28;
                    uStack_26c0 = puVar28[1];
                    puVar28 = (undefined8 *)(local_2640 + (long)(local_26b4 << 2) * 4);
                    local_26d8 = *puVar28;
                    uStack_26d0 = puVar28[1];
                    local_2258 = (float)local_26c8;
                    fStack_2254 = (float)((ulong)local_26c8 >> 0x20);
                    fStack_2250 = (float)uStack_26c0;
                    fStack_224c = (float)((ulong)uStack_26c0 >> 0x20);
                    local_2268 = (float)local_26d8;
                    fStack_2264 = (float)((ulong)local_26d8 >> 0x20);
                    fStack_2260 = (float)uStack_26d0;
                    fStack_225c = (float)((ulong)uStack_26d0 >> 0x20);
                    local_26a8 = CONCAT44(fStack_2254 * fStack_2264 + fStack_2284,
                                          local_2258 * local_2268 + local_2288);
                    uStack_26a0 = CONCAT44(fStack_224c * fStack_225c + fStack_227c,
                                           fStack_2250 * fStack_2260 + fStack_2280);
                    local_26b4 = local_26b4 + 1;
                  }
                  plVar1 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
                  switch(*(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110)) {
                  case 1:
                    auVar5._8_8_ = uStack_26a0;
                    auVar5._0_8_ = local_26a8;
                    auVar36 = maxps(auVar5,ZEXT816(0));
                    break;
                  case 2:
                    fVar31 = *(float *)*plVar1;
                    auVar8._8_8_ = uStack_26a0;
                    auVar8._0_8_ = local_26a8;
                    auVar45 = maxps(ZEXT816(0),auVar8);
                    auVar9._8_8_ = uStack_26a0;
                    auVar9._0_8_ = local_26a8;
                    auVar35 = minps(ZEXT816(0),auVar9);
                    fStack_1e40 = auVar35._8_4_;
                    fStack_1e3c = auVar35._12_4_;
                    auVar36._4_4_ = auVar45._4_4_ + fVar31 * auVar35._4_4_;
                    auVar36._0_4_ = auVar45._0_4_ + fVar31 * auVar35._0_4_;
                    auVar36._12_4_ = auVar45._12_4_ + fVar31 * fStack_1e3c;
                    auVar36._8_4_ = auVar45._8_4_ + fVar31 * fStack_1e40;
                    break;
                  case 3:
                    uVar2 = *(undefined4 *)*plVar1;
                    auVar6._4_4_ = uVar2;
                    auVar6._0_4_ = uVar2;
                    auVar6._12_4_ = uVar2;
                    auVar6._8_4_ = uVar2;
                    uVar2 = *(undefined4 *)(*plVar1 + 4);
                    auVar10._4_4_ = uVar2;
                    auVar10._0_4_ = uVar2;
                    auVar10._12_4_ = uVar2;
                    auVar10._8_4_ = uVar2;
                    auVar7._8_8_ = uStack_26a0;
                    auVar7._0_8_ = local_26a8;
                    auVar36 = maxps(auVar7,auVar6);
                    auVar36 = minps(auVar36,auVar10);
                    break;
                  case 4:
                    local_16c8 = CONCAT44(0.0 - fStack_2284,0.0 - local_2288);
                    uStack_16c0._0_4_ = 0.0 - fStack_2280;
                    uStack_16c0._4_4_ = 0.0 - fStack_227c;
                    auVar17._8_8_ = uStack_16c0;
                    auVar17._0_8_ = local_16c8;
                    auVar16._8_8_ = 0x42b0c0a542b0c0a5;
                    auVar16._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar36 = minps(auVar17,auVar16);
                    auVar15._8_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar15._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar36 = maxps(auVar36,auVar15);
                    local_1628 = auVar36._0_4_;
                    fStack_1624 = auVar36._4_4_;
                    fStack_1620 = auVar36._8_4_;
                    fStack_161c = auVar36._12_4_;
                    fVar31 = local_1628 * 1.442695 + 0.5;
                    fVar37 = fStack_1624 * 1.442695 + 0.5;
                    fVar39 = fStack_1620 * 1.442695 + 0.5;
                    fVar43 = fStack_161c * 1.442695 + 0.5;
                    fVar32 = (float)(int)fVar31;
                    fVar38 = (float)(int)fVar37;
                    fVar40 = (float)(int)fVar39;
                    fVar44 = (float)(int)fVar43;
                    local_1718 = CONCAT44(-(uint)(fVar37 < fVar38),-(uint)(fVar31 < fVar32));
                    uStack_1710 = CONCAT44(-(uint)(fVar43 < fVar44),-(uint)(fVar39 < fVar40));
                    local_12d8 = (float)(local_1718 & 0x3f8000003f800000);
                    fStack_12d4 = (float)((local_1718 & 0x3f8000003f800000) >> 0x20);
                    fStack_12d0 = (float)(uStack_1710 & 0x3f8000003f800000);
                    fStack_12cc = (float)((uStack_1710 & 0x3f8000003f800000) >> 0x20);
                    fVar32 = fVar32 - local_12d8;
                    fVar38 = fVar38 - fStack_12d4;
                    fVar40 = fVar40 - fStack_12d0;
                    fVar44 = fVar44 - fStack_12cc;
                    fVar31 = (local_1628 - fVar32 * 0.6933594) - fVar32 * -0.00021219444;
                    fVar37 = (fStack_1624 - fVar38 * 0.6933594) - fVar38 * -0.00021219444;
                    fVar39 = (fStack_1620 - fVar40 * 0.6933594) - fVar40 * -0.00021219444;
                    fVar43 = (fStack_161c - fVar44 * 0.6933594) - fVar44 * -0.00021219444;
                    auVar4._8_8_ = 0x3f8000003f800000;
                    auVar4._0_8_ = 0x3f8000003f800000;
                    auVar11._4_4_ =
                         ((((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) *
                             fVar37 + 0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5) *
                          fVar37 * fVar37 + fVar37 + 1.0) * (float)((int)fVar38 + 0x7f) + 1.0;
                    auVar11._0_4_ =
                         ((((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) *
                             fVar31 + 0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) *
                          fVar31 * fVar31 + fVar31 + 1.0) * (float)(((int)fVar32 + 0x7f) * 0x800000)
                         + 1.0;
                    auVar11._8_4_ =
                         ((((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) *
                             fVar39 + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5) *
                          fVar39 * fVar39 + fVar39 + 1.0) * (float)((int)fVar40 + 0x7f) + 1.0;
                    auVar11._12_4_ =
                         ((((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) *
                             fVar43 + 0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5) *
                          fVar43 * fVar43 + fVar43 + 1.0) * (float)((int)fVar44 + 0x7f) + 1.0;
                    auVar36 = divps(auVar4,auVar11);
                    break;
                  case 5:
                    auVar14._8_8_ = uStack_26a0;
                    auVar14._0_8_ = local_26a8;
                    auVar13._8_8_ = 0x42b0c0a542b0c0a5;
                    auVar13._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar36 = minps(auVar14,auVar13);
                    auVar12._8_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar36 = maxps(auVar36,auVar12);
                    local_1a88 = auVar36._0_4_;
                    fStack_1a84 = auVar36._4_4_;
                    fStack_1a80 = auVar36._8_4_;
                    fStack_1a7c = auVar36._12_4_;
                    fVar31 = local_1a88 * 1.442695 + 0.5;
                    fVar37 = fStack_1a84 * 1.442695 + 0.5;
                    fVar39 = fStack_1a80 * 1.442695 + 0.5;
                    fVar43 = fStack_1a7c * 1.442695 + 0.5;
                    fVar32 = (float)(int)fVar31;
                    fVar38 = (float)(int)fVar37;
                    fVar40 = (float)(int)fVar39;
                    fVar44 = (float)(int)fVar43;
                    local_1b78 = CONCAT44(-(uint)(fVar37 < fVar38),-(uint)(fVar31 < fVar32));
                    uStack_1b70 = CONCAT44(-(uint)(fVar43 < fVar44),-(uint)(fVar39 < fVar40));
                    local_12b8 = (float)(local_1b78 & 0x3f8000003f800000);
                    fStack_12b4 = (float)((local_1b78 & 0x3f8000003f800000) >> 0x20);
                    fStack_12b0 = (float)(uStack_1b70 & 0x3f8000003f800000);
                    fStack_12ac = (float)((uStack_1b70 & 0x3f8000003f800000) >> 0x20);
                    fVar32 = fVar32 - local_12b8;
                    fVar38 = fVar38 - fStack_12b4;
                    fVar40 = fVar40 - fStack_12b0;
                    fVar44 = fVar44 - fStack_12ac;
                    fVar31 = (local_1a88 - fVar32 * 0.6933594) - fVar32 * -0.00021219444;
                    fVar37 = (fStack_1a84 - fVar38 * 0.6933594) - fVar38 * -0.00021219444;
                    fVar39 = (fStack_1a80 - fVar40 * 0.6933594) - fVar40 * -0.00021219444;
                    fVar43 = (fStack_1a7c - fVar44 * 0.6933594) - fVar44 * -0.00021219444;
                    fVar31 = ((((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) *
                                 fVar31 + 0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) *
                              fVar31 * fVar31 + fVar31 + 1.0) *
                             (float)(((int)fVar32 + 0x7f) * 0x800000) + 1.0;
                    fVar32 = ((((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) *
                                 fVar37 + 0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5) *
                              fVar37 * fVar37 + fVar37 + 1.0) * (float)((int)fVar38 + 0x7f) + 1.0;
                    fVar37 = ((((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) *
                                 fVar39 + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5) *
                              fVar39 * fVar39 + fVar39 + 1.0) * (float)((int)fVar40 + 0x7f) + 1.0;
                    fVar38 = ((((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) *
                                 fVar43 + 0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5) *
                              fVar43 * fVar43 + fVar43 + 1.0) * (float)((int)fVar44 + 0x7f) + 1.0;
                    local_808 = CONCAT44(fVar32,fVar31);
                    uStack_800._0_4_ = fVar37;
                    uStack_800._4_4_ = fVar38;
                    auVar24._8_8_ = uStack_800;
                    auVar24._0_8_ = local_808;
                    auVar23._8_8_ = 0x80000000800000;
                    auVar23._0_8_ = 0x80000000800000;
                    auVar36 = maxps(auVar24,auVar23);
                    local_808 = auVar36._0_8_;
                    uStack_800 = auVar36._8_8_;
                    local_158 = auVar36._0_4_;
                    uStack_154 = auVar36._4_4_;
                    uStack_150 = auVar36._8_4_;
                    uStack_14c = auVar36._12_4_;
                    uVar33 = local_808 & 0x807fffff807fffff | 0x3f0000003f000000;
                    uVar41 = uStack_800 & 0x807fffff807fffff | 0x3f0000003f000000;
                    local_c8 = (float)uVar33;
                    fStack_c4 = (float)(uVar33 >> 0x20);
                    fStack_c0 = (float)uVar41;
                    fStack_bc = (float)(uVar41 >> 0x20);
                    uVar33 = uVar33 & CONCAT44(-(uint)(fStack_c4 < 0.70710677),
                                               -(uint)(local_c8 < 0.70710677));
                    uVar41 = uVar41 & CONCAT44(-(uint)(fStack_bc < 0.70710677),
                                               -(uint)(fStack_c0 < 0.70710677));
                    uVar34 = CONCAT44(-(uint)(fStack_c4 < 0.70710677),-(uint)(local_c8 < 0.70710677)
                                     ) & 0x3f8000003f800000;
                    uVar42 = CONCAT44(-(uint)(fStack_bc < 0.70710677),
                                      -(uint)(fStack_c0 < 0.70710677)) & 0x3f8000003f800000;
                    local_238 = (float)uVar34;
                    fStack_234 = (float)(uVar34 >> 0x20);
                    fStack_230 = (float)uVar42;
                    fStack_22c = (float)(uVar42 >> 0x20);
                    local_238 = ((float)(int)((local_158 >> 0x17) - 0x7f) + 1.0) - local_238;
                    fStack_234 = ((float)(int)((uStack_154 >> 0x17) - 0x7f) + 1.0) - fStack_234;
                    fStack_230 = ((float)(int)((uStack_150 >> 0x17) - 0x7f) + 1.0) - fStack_230;
                    fStack_22c = ((float)(int)((uStack_14c >> 0x17) - 0x7f) + 1.0) - fStack_22c;
                    local_7d8 = (float)uVar33;
                    fStack_7d4 = (float)(uVar33 >> 0x20);
                    fStack_7d0 = (float)uVar41;
                    fStack_7cc = (float)(uVar41 >> 0x20);
                    local_7d8 = (local_c8 - 1.0) + local_7d8;
                    fStack_7d4 = (fStack_c4 - 1.0) + fStack_7d4;
                    fStack_7d0 = (fStack_c0 - 1.0) + fStack_7d0;
                    fStack_7cc = (fStack_bc - 1.0) + fStack_7cc;
                    local_808 = CONCAT44(fStack_234 * 0.6933594 +
                                         fStack_7d4 +
                                         ((fStack_234 * -0.00021219444 +
                                          ((((((((fStack_7d4 * 0.070376836 + -0.1151461) *
                                                 fStack_7d4 + 0.116769984) * fStack_7d4 +
                                               -0.12420141) * fStack_7d4 + 0.14249323) * fStack_7d4
                                             + -0.16668057) * fStack_7d4 + 0.20000714) * fStack_7d4
                                           + -0.24999994) * fStack_7d4 + 0.3333333) * fStack_7d4 *
                                          fStack_7d4 * fStack_7d4) - fStack_7d4 * fStack_7d4 * 0.5),
                                         local_238 * 0.6933594 +
                                         local_7d8 +
                                         ((local_238 * -0.00021219444 +
                                          ((((((((local_7d8 * 0.070376836 + -0.1151461) * local_7d8
                                                + 0.116769984) * local_7d8 + -0.12420141) *
                                               local_7d8 + 0.14249323) * local_7d8 + -0.16668057) *
                                             local_7d8 + 0.20000714) * local_7d8 + -0.24999994) *
                                           local_7d8 + 0.3333333) * local_7d8 *
                                          local_7d8 * local_7d8) - local_7d8 * local_7d8 * 0.5));
                    uStack_800._0_4_ =
                         fStack_230 * 0.6933594 +
                         fStack_7d0 +
                         ((fStack_230 * -0.00021219444 +
                          ((((((((fStack_7d0 * 0.070376836 + -0.1151461) * fStack_7d0 + 0.116769984)
                                * fStack_7d0 + -0.12420141) * fStack_7d0 + 0.14249323) * fStack_7d0
                             + -0.16668057) * fStack_7d0 + 0.20000714) * fStack_7d0 + -0.24999994) *
                           fStack_7d0 + 0.3333333) * fStack_7d0 * fStack_7d0 * fStack_7d0) -
                         fStack_7d0 * fStack_7d0 * 0.5);
                    uStack_800._4_4_ =
                         fStack_22c * 0.6933594 +
                         fStack_7cc +
                         ((fStack_22c * -0.00021219444 +
                          ((((((((fStack_7cc * 0.070376836 + -0.1151461) * fStack_7cc + 0.116769984)
                                * fStack_7cc + -0.12420141) * fStack_7cc + 0.14249323) * fStack_7cc
                             + -0.16668057) * fStack_7cc + 0.20000714) * fStack_7cc + -0.24999994) *
                           fStack_7cc + 0.3333333) * fStack_7cc * fStack_7cc * fStack_7cc) -
                         fStack_7cc * fStack_7cc * 0.5);
                    local_808 = local_808 | CONCAT44(-(uint)(fVar32 <= 0.0),-(uint)(fVar31 <= 0.0));
                    uStack_800 = uStack_800 |
                                 CONCAT44(-(uint)(fVar38 <= 0.0),-(uint)(fVar37 <= 0.0));
                    local_f38 = (float)local_808;
                    fStack_f34 = (float)(local_808 >> 0x20);
                    fStack_f30 = (float)uStack_800;
                    fStack_f2c = (float)(uStack_800 >> 0x20);
                    local_e28 = CONCAT44(0.0 - fStack_f34 * 2.0,0.0 - local_f38 * 2.0);
                    uStack_e20._0_4_ = 0.0 - fStack_f30 * 2.0;
                    uStack_e20._4_4_ = 0.0 - fStack_f2c * 2.0;
                    auVar22._8_8_ = uStack_e20;
                    auVar22._0_8_ = local_e28;
                    auVar21._8_8_ = 0x42b0c0a542b0c0a5;
                    auVar21._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar36 = minps(auVar22,auVar21);
                    auVar20._8_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar36 = maxps(auVar36,auVar20);
                    local_d88 = auVar36._0_4_;
                    fStack_d84 = auVar36._4_4_;
                    fStack_d80 = auVar36._8_4_;
                    fStack_d7c = auVar36._12_4_;
                    fVar31 = local_d88 * 1.442695 + 0.5;
                    fVar37 = fStack_d84 * 1.442695 + 0.5;
                    fVar39 = fStack_d80 * 1.442695 + 0.5;
                    fVar43 = fStack_d7c * 1.442695 + 0.5;
                    fVar32 = (float)(int)fVar31;
                    fVar38 = (float)(int)fVar37;
                    fVar40 = (float)(int)fVar39;
                    fVar44 = (float)(int)fVar43;
                    local_e78 = CONCAT44(-(uint)(fVar37 < fVar38),-(uint)(fVar31 < fVar32));
                    uStack_e70 = CONCAT44(-(uint)(fVar43 < fVar44),-(uint)(fVar39 < fVar40));
                    local_a38 = (float)(local_e78 & 0x3f8000003f800000);
                    fStack_a34 = (float)((local_e78 & 0x3f8000003f800000) >> 0x20);
                    fStack_a30 = (float)(uStack_e70 & 0x3f8000003f800000);
                    fStack_a2c = (float)((uStack_e70 & 0x3f8000003f800000) >> 0x20);
                    fVar32 = fVar32 - local_a38;
                    fVar38 = fVar38 - fStack_a34;
                    fVar40 = fVar40 - fStack_a30;
                    fVar44 = fVar44 - fStack_a2c;
                    fVar31 = (local_d88 - fVar32 * 0.6933594) - fVar32 * -0.00021219444;
                    fVar37 = (fStack_d84 - fVar38 * 0.6933594) - fVar38 * -0.00021219444;
                    fVar39 = (fStack_d80 - fVar40 * 0.6933594) - fVar40 * -0.00021219444;
                    fVar43 = (fStack_d7c - fVar44 * 0.6933594) - fVar44 * -0.00021219444;
                    auVar19._8_8_ = 0x3f8000003f800000;
                    auVar19._0_8_ = 0x3f8000003f800000;
                    auVar18._4_4_ =
                         ((((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) *
                             fVar37 + 0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5) *
                          fVar37 * fVar37 + fVar37 + 1.0) * (float)((int)fVar38 + 0x7f) + 1.0;
                    auVar18._0_4_ =
                         ((((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) *
                             fVar31 + 0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) *
                          fVar31 * fVar31 + fVar31 + 1.0) * (float)(((int)fVar32 + 0x7f) * 0x800000)
                         + 1.0;
                    auVar18._8_4_ =
                         ((((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) *
                             fVar39 + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5) *
                          fVar39 * fVar39 + fVar39 + 1.0) * (float)((int)fVar40 + 0x7f) + 1.0;
                    auVar18._12_4_ =
                         ((((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) *
                             fVar43 + 0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5) *
                          fVar43 * fVar43 + fVar43 + 1.0) * (float)((int)fVar44 + 0x7f) + 1.0;
                    auVar36 = divps(auVar19,auVar18);
                    local_f58 = auVar36._0_4_;
                    fStack_f54 = auVar36._4_4_;
                    fStack_f50 = auVar36._8_4_;
                    fStack_f4c = auVar36._12_4_;
                    auVar36._4_4_ = fStack_2284 * (fStack_f54 * 2.0 - 1.0);
                    auVar36._0_4_ = local_2288 * (local_f58 * 2.0 - 1.0);
                    auVar36._12_4_ = fStack_227c * (fStack_f4c * 2.0 - 1.0);
                    auVar36._8_4_ = fStack_2280 * (fStack_f50 * 2.0 - 1.0);
                    break;
                  case 6:
                    fVar31 = *(float *)*plVar1;
                    fVar32 = *(float *)(*plVar1 + 4);
                    local_1cb8 = CONCAT44(fStack_2284 * fVar31 + fVar32,local_2288 * fVar31 + fVar32
                                         );
                    uStack_1cb0._0_4_ = fStack_2280 * fVar31 + fVar32;
                    uStack_1cb0._4_4_ = fStack_227c * fVar31 + fVar32;
                    auVar35._8_8_ = uStack_1cb0;
                    auVar35._0_8_ = local_1cb8;
                    auVar36 = maxps(auVar35,ZEXT816(0));
                    auVar45._8_8_ = 0x3f8000003f800000;
                    auVar45._0_8_ = 0x3f8000003f800000;
                    auVar36 = minps(auVar36,auVar45);
                    local_1c38 = auVar36._0_4_;
                    fStack_1c34 = auVar36._4_4_;
                    fStack_1c30 = auVar36._8_4_;
                    fStack_1c2c = auVar36._12_4_;
                    auVar36._4_4_ = fStack_1c34 * fStack_2284;
                    auVar36._0_4_ = local_1c38 * local_2288;
                    auVar36._12_4_ = fStack_1c2c * fStack_227c;
                    auVar36._8_4_ = fStack_1c30 * fStack_2280;
                    break;
                  default:
                    auVar36._8_8_ = uStack_26a0;
                    auVar36._0_8_ = local_26a8;
                  }
                  local_26a8 = auVar36._0_8_;
                  uStack_26a0 = auVar36._8_8_;
                  puVar28 = (undefined8 *)((long)local_25f0 + (long)(local_2690 << 2) * 4);
                  *puVar28 = local_26a8;
                  puVar28[1] = uStack_26a0;
                }
                local_25f0 = (void *)((long)local_25f0 + (long)(local_258c << 2) * 4);
              }
              local_2688 = 0;
              local_2678 = 0;
              local_2670 = 0;
              local_2660 = 0;
              local_265c = 0;
              local_2658 = 0;
              local_2654 = 0;
              local_2650 = 0;
              local_2648 = 0;
              local_2680 = 0;
            }
            local_24e4 = 0;
            local_2588 = 1;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460));
          }
          goto LAB_0178d5bd;
        }
        if (iVar47 == 1) {
          if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
             (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            convdw3x3s1_sse(in_stack_ffffffffffffd600,in_stack_ffffffffffffd5f8,
                            in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8,
                            (Option *)CONCAT44(in_stack_ffffffffffffd5e4,in_stack_ffffffffffffd5e0))
            ;
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_24e4 = 0;
            local_2588 = 1;
            goto LAB_0178d5bd;
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convdw3x3s2_sse(in_stack_ffffffffffffd5f0,in_stack_ffffffffffffd5e8,
                            (Mat *)CONCAT44(in_stack_ffffffffffffd5e4,in_stack_ffffffffffffd5e0),
                            (Mat *)CONCAT44(in_stack_ffffffffffffd5dc,in_stack_ffffffffffffd5d8),
                            in_stack_ffffffffffffd5d0);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
            }
            local_24e4 = 0;
            local_2588 = 1;
            goto LAB_0178d5bd;
          }
        }
      }
      local_26dc = (iVar25 * iVar47) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      local_26e0 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      local_26e4 = 1;
      local_26e8 = 1;
      if ((*(byte *)((long)in_RCX + 0x27) & 1) != 0) {
        local_26e4 = 1;
        if (local_26dc % 4 == 0) {
          local_26e4 = 4;
        }
        local_26e8 = 1;
        if (local_26e0 % 4 == 0) {
          local_26e8 = 4;
        }
      }
      local_2730 = local_2578;
      local_2728 = local_2570;
      local_2720 = local_2568;
      local_2718 = local_2560;
      local_2710 = local_2558;
      local_2708 = local_2550;
      local_2704 = local_254c;
      local_2700 = local_2548;
      local_26fc = local_2544;
      local_26f8 = local_2540;
      local_26f0 = local_2538;
      if (local_2570 != (int *)0x0) {
        LOCK();
        *local_2570 = *local_2570 + 1;
        UNLOCK();
      }
      if (local_26e4 < iVar47) {
        local_2778 = *in_RCX;
        local_2768 = in_RCX[2];
        uStack_2760 = in_RCX[3];
        local_2758 = in_RCX[4];
        uStack_2750 = in_RCX[5];
        local_2748 = in_RCX[6];
        uStack_2740 = in_RCX[7];
        uStack_2770 = in_RCX[2];
        convert_packing(in_stack_ffffffffffffd490,in_stack_ffffffffffffd488,
                        (int)((ulong)in_stack_ffffffffffffd480 >> 0x20),in_stack_ffffffffffffd478);
      }
      local_27c0 = *in_RDX;
      local_27b8 = (int *)in_RDX[1];
      local_27b0 = in_RDX[2];
      local_27a8 = *(undefined4 *)(in_RDX + 3);
      local_27a0 = (long *)in_RDX[4];
      local_2798 = *(undefined4 *)(in_RDX + 5);
      local_2794 = *(int *)((long)in_RDX + 0x2c);
      local_2790 = *(int *)(in_RDX + 6);
      local_278c = *(int *)((long)in_RDX + 0x34);
      local_2788 = *(int *)(in_RDX + 7);
      local_2780 = in_RDX[8];
      if (local_27b8 != (int *)0x0) {
        LOCK();
        *local_27b8 = *local_27b8 + 1;
        UNLOCK();
      }
      if ((local_26e8 < local_2594) &&
         (Mat::create(in_stack_ffffffffffffd480,(int)((ulong)in_stack_ffffffffffffd478 >> 0x20),
                      (int)in_stack_ffffffffffffd478,(int)((ulong)in_stack_ffffffffffffd470 >> 0x20)
                      ,in_stack_ffffffffffffd468,in_stack_ffffffffffffd464,
                      (Allocator *)CONCAT17(in_stack_ffffffffffffd4e7,in_stack_ffffffffffffd4e0)),
         local_27c0 == (void *)0x0 || (long)local_2780 * (long)local_2788 == 0)) {
        local_24e4 = -100;
      }
      else {
        for (local_27c4 = 0;
            local_27c4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
            local_27c4 = local_27c4 + 1) {
          local_27d8 = local_26dc / local_26e4;
          local_2810 = (void *)((long)local_2730 +
                               local_26f0 * ((local_26dc * local_27c4) / local_26e4) * local_2720);
          local_2808 = (int *)0x0;
          local_2800 = local_2720;
          local_27f8 = local_2718;
          local_27f0 = local_2710;
          local_27e4 = local_2704;
          local_27e0 = local_2700;
          local_27dc = local_26fc;
          local_27d0 = ((long)local_2704 * (long)local_2700 * (long)local_26fc * local_2720 + 0xf &
                       0xfffffffffffffff0) / local_2720;
          local_2820 = local_26e0 / local_26e8;
          local_2858 = (void *)((long)local_27c0 +
                               (long)local_2780 * (long)((local_26e0 * local_27c4) / local_26e8) *
                               (long)local_27b0);
          local_2850 = (int *)0x0;
          local_2848 = local_27b0;
          local_2840 = local_27a8;
          local_2838 = local_27a0;
          local_282c = local_2794;
          local_2828 = local_2790;
          local_2824 = local_278c;
          local_2818 = ((long)local_2794 * (long)local_2790 * (long)local_278c * (long)local_27b0 +
                        0xfU & 0xfffffffffffffff0) / (ulong)local_27b0;
          local_27e8 = local_2708;
          local_2830 = local_2798;
          ppLVar29 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                               ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                (in_RDI + 2),(long)local_27c4);
          local_2860 = *ppLVar29;
          local_28a8 = *in_RCX;
          local_2898 = in_RCX[2];
          uStack_2890 = in_RCX[3];
          local_2888 = *(undefined4 *)(in_RCX + 4);
          uStack_2884 = *(undefined4 *)((long)in_RCX + 0x24);
          uStack_2880 = *(undefined4 *)(in_RCX + 5);
          uStack_287c = *(undefined4 *)((long)in_RCX + 0x2c);
          local_2878 = in_RCX[6];
          uStack_2870 = in_RCX[7];
          plStack_28a0 = local_27a0;
          (*local_2860->_vptr_Layer[7])(local_2860,&local_2810,&local_2858,&local_28a8);
          if (local_2850 != (int *)0x0) {
            LOCK();
            iVar25 = *local_2850;
            *local_2850 = *local_2850 + -1;
            UNLOCK();
            if (iVar25 == 1) {
              if (local_2838 == (long *)0x0) {
                if (local_2858 != (void *)0x0) {
                  free(local_2858);
                }
              }
              else {
                (**(code **)(*local_2838 + 0x18))(local_2838,local_2858);
              }
            }
          }
          local_2858 = (void *)0x0;
          local_2848 = (void *)0x0;
          local_2840 = 0;
          local_2830 = 0;
          local_282c = 0;
          local_2828 = 0;
          local_2824 = 0;
          local_2820 = 0;
          local_2818 = 0;
          local_2850 = (int *)0x0;
          if (local_2808 != (int *)0x0) {
            LOCK();
            iVar25 = *local_2808;
            *local_2808 = *local_2808 + -1;
            UNLOCK();
            if (iVar25 == 1) {
              if (local_27f0 == (long *)0x0) {
                if (local_2810 != (void *)0x0) {
                  free(local_2810);
                }
              }
              else {
                (**(code **)(*local_27f0 + 0x18))(local_27f0,local_2810);
              }
            }
          }
          local_2810 = (void *)0x0;
          local_2800 = 0;
          local_27f8 = 0;
          local_27e8 = 0;
          local_27e4 = 0;
          local_27e0 = 0;
          local_27dc = 0;
          local_27d8 = 0;
          local_27d0 = 0;
          local_2808 = (int *)0x0;
        }
        if (local_26e8 < local_2594) {
          convert_packing(in_stack_ffffffffffffd490,in_stack_ffffffffffffd488,
                          (int)((ulong)in_stack_ffffffffffffd480 >> 0x20),in_stack_ffffffffffffd478)
          ;
        }
        else if (in_RDX != &local_27c0) {
          if (local_27b8 != (int *)0x0) {
            LOCK();
            *local_27b8 = *local_27b8 + 1;
            UNLOCK();
          }
          ppvVar46 = in_RDX;
          if (in_RDX[1] != (void *)0x0) {
            piVar3 = (int *)in_RDX[1];
            LOCK();
            iVar25 = *piVar3;
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (iVar25 == 1) {
              if (in_RDX[4] == (void *)0x0) {
                if (*in_RDX != (void *)0x0) {
                  free(*in_RDX);
                }
              }
              else {
                (**(code **)(*in_RDX[4] + 0x18))(in_RDX[4],*in_RDX);
              }
            }
          }
          *in_RDX = (void *)0x0;
          in_RDX[2] = (void *)0x0;
          *(undefined4 *)(in_RDX + 3) = 0;
          *(undefined4 *)(in_RDX + 5) = 0;
          *(undefined4 *)((long)in_RDX + 0x2c) = 0;
          *(undefined4 *)(in_RDX + 6) = 0;
          *(undefined4 *)((long)in_RDX + 0x34) = 0;
          *(undefined4 *)(in_RDX + 7) = 0;
          in_RDX[8] = (void *)0x0;
          in_RDX[1] = (void *)0x0;
          *ppvVar46 = local_27c0;
          ppvVar46[1] = local_27b8;
          ppvVar46[2] = local_27b0;
          *(undefined4 *)(ppvVar46 + 3) = local_27a8;
          ppvVar46[4] = local_27a0;
          *(undefined4 *)(ppvVar46 + 5) = local_2798;
          *(int *)((long)ppvVar46 + 0x2c) = local_2794;
          *(int *)(ppvVar46 + 6) = local_2790;
          *(int *)((long)ppvVar46 + 0x34) = local_278c;
          *(int *)(ppvVar46 + 7) = local_2788;
          ppvVar46[8] = local_2780;
        }
        local_24e4 = 0;
      }
      local_2588 = 1;
      ppvVar46 = &local_27c0;
      if (local_27b8 != (int *)0x0) {
        LOCK();
        iVar25 = *local_27b8;
        *local_27b8 = *local_27b8 + -1;
        UNLOCK();
        if (iVar25 == 1) {
          if (local_27a0 == (long *)0x0) {
            if (local_27c0 != (void *)0x0) {
              free(local_27c0);
            }
          }
          else {
            (**(code **)(*local_27a0 + 0x18))(local_27a0,local_27c0);
          }
        }
      }
      *ppvVar46 = (void *)0x0;
      ppvVar46[2] = (void *)0x0;
      *(undefined4 *)(ppvVar46 + 3) = 0;
      *(undefined4 *)(ppvVar46 + 5) = 0;
      *(undefined4 *)((long)ppvVar46 + 0x2c) = 0;
      *(undefined4 *)(ppvVar46 + 6) = 0;
      *(undefined4 *)((long)ppvVar46 + 0x34) = 0;
      *(undefined4 *)(ppvVar46 + 7) = 0;
      ppvVar46[8] = (void *)0x0;
      ppvVar46[1] = (void *)0x0;
      ppvVar46 = &local_2730;
      if (local_2728 != (int *)0x0) {
        LOCK();
        iVar25 = *local_2728;
        *local_2728 = *local_2728 + -1;
        UNLOCK();
        if (iVar25 == 1) {
          if (local_2710 == (long *)0x0) {
            if (local_2730 != (void *)0x0) {
              free(local_2730);
            }
          }
          else {
            (**(code **)(*local_2710 + 0x18))(local_2710,local_2730);
          }
        }
      }
      *ppvVar46 = (void *)0x0;
      ppvVar46[2] = (void *)0x0;
      *(undefined4 *)(ppvVar46 + 3) = 0;
      *(undefined4 *)(ppvVar46 + 5) = 0;
      *(undefined4 *)((long)ppvVar46 + 0x2c) = 0;
      *(undefined4 *)(ppvVar46 + 6) = 0;
      *(undefined4 *)((long)ppvVar46 + 0x34) = 0;
      *(undefined4 *)(ppvVar46 + 7) = 0;
      ppvVar46[8] = (void *)0x0;
      ppvVar46[1] = (void *)0x0;
    }
  }
LAB_0178d5bd:
  ppvVar46 = &local_2578;
  if (local_2570 != (int *)0x0) {
    LOCK();
    iVar25 = *local_2570;
    *local_2570 = *local_2570 + -1;
    UNLOCK();
    if (iVar25 == 1) {
      if (local_2558 == (long *)0x0) {
        if (local_2578 != (void *)0x0) {
          free(local_2578);
        }
      }
      else {
        (**(code **)(*local_2558 + 0x18))(local_2558,local_2578);
      }
    }
  }
  *ppvVar46 = (void *)0x0;
  ppvVar46[2] = (void *)0x0;
  *(undefined4 *)(ppvVar46 + 3) = 0;
  *(undefined4 *)(ppvVar46 + 5) = 0;
  *(undefined4 *)((long)ppvVar46 + 0x2c) = 0;
  *(undefined4 *)(ppvVar46 + 6) = 0;
  *(undefined4 *)((long)ppvVar46 + 0x34) = 0;
  *(undefined4 *)(ppvVar46 + 7) = 0;
  ppvVar46[8] = (void *)0x0;
  ppvVar46[1] = (void *)0x0;
  return local_24e4;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}